

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

int dosave0(boolean emergency)

{
  boolean bVar1;
  undefined1 local_1fd0 [7];
  boolean log_disabled;
  memfile mf;
  int fd;
  boolean emergency_local;
  
  bVar1 = iflags.disable_log;
  mf.tags[0x3f0]._7_1_ = emergency;
  mnew((memfile *)local_1fd0,(memfile *)0x0);
  mf.tags[0x3f0]._0_4_ = logfile;
  iflags.disable_log = '\0';
  log_finish(LS_SAVED);
  iflags.disable_log = bVar1;
  vision_recalc(2);
  savegame((memfile *)local_1fd0);
  store_mf((int)mf.tags[0x3f0],(memfile *)local_1fd0);
  freedynamicdata();
  return 1;
}

Assistant:

int dosave0(boolean emergency)
{
	int fd;
	struct memfile mf;
	boolean log_disabled = iflags.disable_log;

	mnew(&mf, NULL);

	fd = logfile;

	/* when  we leave via nh_exit, logging is disabled. It needs to be
	 * enabled briefly so that log_finish will update the log header. */
	iflags.disable_log = FALSE;
	log_finish(LS_SAVED);
	iflags.disable_log = log_disabled;
	vision_recalc(2);	/* shut down vision to prevent problems
				   in the event of an impossible() call */

	savegame(&mf);
	store_mf(fd, &mf);	/* also frees mf */

	freedynamicdata();

	return TRUE;
}